

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseContainer.cpp
# Opt level: O3

void __thiscall
Saturation::ActiveClauseContainer::onLimitsUpdated
          (ActiveClauseContainer *this,PassiveClauseContainer *limits)

{
  Cell *pCVar1;
  Clause *pCVar2;
  int iVar3;
  Cell *pCVar4;
  
  iVar3 = (*(limits->super_RandomAccessClauseContainer).super_ClauseContainer._vptr_ClauseContainer
            [0xd])(limits);
  if ((char)iVar3 != '\0') {
    if ((onLimitsUpdated(Saturation::PassiveClauseContainer*)::toRemove == '\0') &&
       (iVar3 = __cxa_guard_acquire(&onLimitsUpdated(Saturation::PassiveClauseContainer*)::toRemove)
       , iVar3 != 0)) {
      onLimitsUpdated::toRemove._capacity = 0x40;
      onLimitsUpdated::toRemove._stack = (Clause **)::operator_new(0x200,0x10);
      onLimitsUpdated::toRemove._end =
           onLimitsUpdated::toRemove._stack + onLimitsUpdated::toRemove._capacity;
      onLimitsUpdated::toRemove._cursor = onLimitsUpdated::toRemove._stack;
      __cxa_atexit(Lib::Stack<Kernel::Clause_*>::~Stack,&onLimitsUpdated::toRemove,&__dso_handle);
      __cxa_guard_release(&onLimitsUpdated(Saturation::PassiveClauseContainer*)::toRemove);
    }
    pCVar1 = (this->_clauses)._afterLast;
    onLimitsUpdated::toRemove._cursor = onLimitsUpdated::toRemove._stack;
    for (pCVar4 = (this->_clauses)._entries; pCVar4 != pCVar1; pCVar4 = pCVar4 + 1) {
      if (1 < pCVar4->code) {
        pCVar2 = pCVar4->value;
        iVar3 = (*(limits->super_RandomAccessClauseContainer).super_ClauseContainer.
                  _vptr_ClauseContainer[0xe])
                          (limits,pCVar2,(ulong)(*(uint *)&pCVar2->field_0x3c & 0xfffff));
        if ((char)iVar3 != '\0') {
          if (onLimitsUpdated::toRemove._cursor == onLimitsUpdated::toRemove._end) {
            Lib::Stack<Kernel::Clause_*>::expand(&onLimitsUpdated::toRemove);
          }
          *onLimitsUpdated::toRemove._cursor = pCVar2;
          onLimitsUpdated::toRemove._cursor = onLimitsUpdated::toRemove._cursor + 1;
        }
      }
    }
    if (onLimitsUpdated::toRemove._cursor != onLimitsUpdated::toRemove._stack) {
      do {
        pCVar2 = onLimitsUpdated::toRemove._cursor[-1];
        onLimitsUpdated::toRemove._cursor = onLimitsUpdated::toRemove._cursor + -1;
        *(int *)(DAT_00b521c0 + 0x1e4) = *(int *)(DAT_00b521c0 + 0x1e4) + 1;
        (*(this->super_RandomAccessClauseContainer).super_ClauseContainer._vptr_ClauseContainer[4])
                  (this,pCVar2);
      } while (onLimitsUpdated::toRemove._cursor != onLimitsUpdated::toRemove._stack);
    }
  }
  return;
}

Assistant:

void ActiveClauseContainer::onLimitsUpdated(PassiveClauseContainer* limits)
{
  ASS(limits);
  if (!limits->mayBeAbleToDiscriminateChildrenOnLimits()) {
    return;
  }

  static Stack<Clause*> toRemove(64);
  toRemove.reset();

  auto rit = _clauses.iter();
  while (rit.hasNext()) {
    Clause* cl=rit.next();
    ASS(cl);

    if (limits->allChildrenNecessarilyExceedLimits(cl, cl->numSelected()))
    {
      ASS(cl->store()==Clause::ACTIVE);
      toRemove.push(cl);
    }
  }

#if OUTPUT_LRS_DETAILS
  if (toRemove.isNonEmpty()) {
    cout<<toRemove.size()<<" active deleted\n";
  }
#endif

  while (toRemove.isNonEmpty()) {
    Clause* removed=toRemove.pop();
    ASS(removed->store()==Clause::ACTIVE);

    RSTAT_CTR_INC("clauses discarded from active on limit update");
    env.statistics->discardedNonRedundantClauses++;

    remove(removed);
    // ASS_NEQ(removed->store(), Clause::ACTIVE); -- the remove could have deleted the clause - do not touch!
  }
}